

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Reader::Init(BP5Reader *this)

{
  float fVar1;
  float fVar2;
  Mode MVar3;
  IO *pIVar4;
  long lVar5;
  char *pcVar6;
  pointer pcVar7;
  Seconds pollSeconds;
  Seconds timeoutSeconds;
  TimePoint timeoutInstant;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  MVar3 = (this->super_Engine).m_OpenMode;
  if ((MVar3 != Read) && (MVar3 != ReadRandomAccess)) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Engine","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BP5Reader","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Init","");
    std::operator+(&local_40,
                   "BPFileReader only supports OpenMode::Read or OpenMode::ReadRandomAccess from",
                   &(this->super_Engine).m_Name);
    helper::Throw<std::invalid_argument>(&local_80,&local_a0,&local_60,&local_40,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  pIVar4 = (this->super_Engine).m_IO;
  pIVar4->m_ReadStreaming = false;
  this->m_ReaderIsRowMajor = pIVar4->m_ArrayOrder == RowMajor;
  (*(this->super_Engine)._vptr_Engine[0x16])(this);
  (*(this->super_Engine)._vptr_Engine[0x17])(this);
  if ((this->super_BP5Engine).m_Parameters.SelectSteps._M_string_length != 0) {
    helper::RangeFilter::ParseSelection
              (&this->m_SelectedSteps,&(this->super_BP5Engine).m_Parameters.SelectSteps);
  }
  if (this->m_ReadMetadataFromFile == true) {
    fVar1 = (this->super_BP5Engine).m_Parameters.OpenTimeoutSecs;
    pcVar7 = (pointer)(double)fVar1;
    fVar2 = (this->super_BP5Engine).m_Parameters.BeginStepPollingFrequencySecs;
    local_a0._M_dataplus._M_p = (pointer)(double)fVar2;
    if (fVar1 < fVar2) {
      local_a0._M_dataplus._M_p = pcVar7;
    }
    local_80._M_dataplus._M_p = pcVar7;
    lVar5 = std::chrono::_V2::steady_clock::now();
    local_60._M_dataplus._M_p = (pointer)((double)pcVar7 * 1000000000.0 + (double)lVar5);
    OpenFiles(this,(TimePoint *)&local_60,(Seconds *)&local_a0,(Seconds *)&local_80);
    local_40._M_dataplus._M_p = (pointer)(local_a0._M_dataplus._M_p / 10.0);
    UpdateBuffer(this,(TimePoint *)&local_60,(Seconds *)&local_40,(Seconds *)&local_80);
    if ((this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length != 0) {
      this->m_dataIsRemote = true;
    }
    pcVar6 = getenv("DoRemote");
    if ((pcVar6 == (char *)0x0) && (pcVar6 = getenv("DoXRootD"), pcVar6 == (char *)0x0)) {
      return;
    }
    this->m_dataIsRemote = true;
  }
  return;
}

Assistant:

void BP5Reader::Init()
{
    if ((m_OpenMode != Mode::Read) && (m_OpenMode != Mode::ReadRandomAccess))
    {
        helper::Throw<std::invalid_argument>("Engine", "BP5Reader", "Init",
                                             "BPFileReader only supports OpenMode::Read or "
                                             "OpenMode::ReadRandomAccess from" +
                                                 m_Name);
    }

    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;
    m_ReaderIsRowMajor = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);
    InitParameters();
    InitTransports();
    if (!m_Parameters.SelectSteps.empty())
    {
        m_SelectedSteps.ParseSelection(m_Parameters.SelectSteps);
    }

    if (m_ReadMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds = Seconds(m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;
        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);

        // Don't try to open the remote file when we open local metadata.  Do that on demand.
        if (!m_Parameters.RemoteDataPath.empty())
            m_dataIsRemote = true;
        if (getenv("DoRemote") || getenv("DoXRootD"))
            m_dataIsRemote = true;
    }
}